

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O2

int ddReorderChildren(DdManager *table,MtrNode *treenode,Cudd_ReorderingType method)

{
  uint lower;
  Cudd_AggregationType CVar1;
  MtrHalfWord MVar2;
  MtrHalfWord MVar3;
  int iVar4;
  code *pcVar5;
  long lVar6;
  int upper;
  long lVar7;
  uint uVar8;
  MtrNode *pMVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  
  iVar4 = table->size;
  if (iVar4 <= (int)treenode->low) {
    return 1;
  }
  lower = table->perm[treenode->index];
  upper = lower + treenode->size + -1;
  if (iVar4 <= upper) {
    pMVar9 = treenode->child;
    if (pMVar9 == (MtrNode *)0x0) {
      upper = iVar4 + -1;
    }
    else {
      upper = -1;
      for (; pMVar9 != (MtrNode *)0x0; pMVar9 = pMVar9->younger) {
        iVar12 = table->perm[pMVar9->low];
        iVar11 = iVar12 + -1;
        if ((int)(pMVar9->size + iVar11) < iVar4) {
          iVar11 = upper;
        }
        if (iVar12 < iVar4) {
          upper = iVar11;
        }
      }
    }
  }
  if (upper == -1) {
    return 1;
  }
  if (treenode->flags == 4) {
    iVar4 = 1;
    goto LAB_0073e9f4;
  }
  switch(method) {
  case CUDD_REORDER_RANDOM:
  case CUDD_REORDER_RANDOM_PIVOT:
    iVar4 = cuddSwapping(table,lower,upper,method);
    break;
  case CUDD_REORDER_SIFT:
    iVar4 = cuddSifting(table,lower,upper);
    break;
  case CUDD_REORDER_SIFT_CONVERGE:
    uVar8 = table->keys;
    iVar12 = table->isolated;
    do {
      uVar13 = uVar8 - iVar12;
      iVar4 = cuddSifting(table,lower,upper);
      uVar8 = table->keys;
      iVar12 = table->isolated;
      if (uVar13 <= uVar8 - iVar12) break;
    } while (iVar4 != 0);
    break;
  case CUDD_REORDER_SYMM_SIFT:
    iVar4 = cuddSymmSifting(table,lower,upper);
    break;
  case CUDD_REORDER_SYMM_SIFT_CONV:
    iVar4 = cuddSymmSiftingConv(table,lower,upper);
    break;
  case CUDD_REORDER_WINDOW2:
  case CUDD_REORDER_WINDOW3:
  case CUDD_REORDER_WINDOW4:
  case CUDD_REORDER_WINDOW2_CONV:
  case CUDD_REORDER_WINDOW3_CONV:
  case CUDD_REORDER_WINDOW4_CONV:
    iVar4 = cuddWindowReorder(table,lower,upper,method);
    break;
  case CUDD_REORDER_GROUP_SIFT:
    CVar1 = table->groupcheck;
    if ((CVar1 == CUDD_GROUP_CHECK7) || (CVar1 == CUDD_GROUP_CHECK5)) {
      pcVar5 = ddExtSymmCheck;
    }
    else {
      if (CVar1 != CUDD_NO_CHECK) {
        fwrite("Unknown group ckecking method\n",0x1e,1,(FILE *)table->err);
        iVar4 = 0;
        break;
      }
      pcVar5 = ddNoCheck;
    }
    iVar4 = 0;
    goto LAB_0073e9ef;
  case CUDD_REORDER_GROUP_SIFT_CONV:
    uVar8 = table->keys;
    iVar12 = table->isolated;
    do {
      CVar1 = table->groupcheck;
      if ((CVar1 == CUDD_GROUP_CHECK7) || (CVar1 == CUDD_GROUP_CHECK5)) {
        pcVar5 = ddExtSymmCheck;
LAB_0073e845:
        ddGroupSifting(table,lower,upper,pcVar5,0);
      }
      else {
        if (CVar1 == CUDD_NO_CHECK) {
          pcVar5 = ddNoCheck;
          goto LAB_0073e845;
        }
        fwrite("Unknown group ckecking method\n",0x1e,1,(FILE *)table->err);
      }
      uVar13 = uVar8 - iVar12;
      iVar4 = cuddWindowReorder(table,lower,upper,CUDD_REORDER_WINDOW4);
      uVar8 = table->keys;
      iVar12 = table->isolated;
    } while ((uVar8 - iVar12 < uVar13) && (iVar4 != 0));
    break;
  case CUDD_REORDER_ANNEALING:
    iVar4 = cuddAnnealing(table,lower,upper);
    break;
  case CUDD_REORDER_GENETIC:
    iVar4 = cuddGa(table,lower,upper);
    break;
  case CUDD_REORDER_LINEAR:
    iVar4 = cuddLinearAndSifting(table,lower,upper);
    break;
  case CUDD_REORDER_LINEAR_CONVERGE:
    uVar8 = table->keys;
    iVar12 = table->isolated;
    do {
      uVar13 = uVar8 - iVar12;
      iVar4 = cuddLinearAndSifting(table,lower,upper);
      uVar8 = table->keys;
      iVar12 = table->isolated;
      if (uVar13 <= uVar8 - iVar12) break;
    } while (iVar4 != 0);
    break;
  case CUDD_REORDER_LAZY_SIFT:
    pcVar5 = ddVarGroupCheck;
    iVar4 = 1;
LAB_0073e9ef:
    iVar4 = ddGroupSifting(table,lower,upper,pcVar5,iVar4);
    break;
  case CUDD_REORDER_EXACT:
    iVar4 = cuddExact(table,lower,upper);
    break;
  default:
    return 0;
  }
LAB_0073e9f4:
  lVar6 = (long)(int)lower;
  if (table->tree != treenode) {
    lVar7 = lVar6 * 0x38 + 0x1c;
    uVar8 = lower;
    for (lVar10 = lVar6; uVar8 = uVar8 + 1, lVar10 < upper; lVar10 = lVar10 + 1) {
      *(uint *)((long)&table->subtables->nodelist + lVar7) = uVar8;
      lVar7 = lVar7 + 0x38;
    }
    table->subtables[upper].next = lower;
  }
  MVar2 = treenode->index;
  MVar3 = table->invperm[lVar6];
  do {
    treenode->index = MVar3;
    treenode = treenode->parent;
    if (treenode == (MtrNode *)0x0) {
      return iVar4;
    }
  } while (treenode->index == MVar2);
  return iVar4;
}

Assistant:

static int
ddReorderChildren(
  DdManager * table,
  MtrNode * treenode,
  Cudd_ReorderingType method)
{
    int lower;
    int upper = -1;
    int result;
    unsigned int initialSize;

    ddFindNodeHiLo(table,treenode,&lower,&upper);
    /* If upper == -1 these variables do not exist yet. */
    if (upper == -1)
        return(1);

    if (treenode->flags == MTR_FIXED) {
        result = 1;
    } else {
#ifdef DD_STATS
        (void) fprintf(table->out," ");
#endif
        switch (method) {
        case CUDD_REORDER_RANDOM:
        case CUDD_REORDER_RANDOM_PIVOT:
            result = cuddSwapping(table,lower,upper,method);
            break;
        case CUDD_REORDER_SIFT:
            result = cuddSifting(table,lower,upper);
            break;
        case CUDD_REORDER_SIFT_CONVERGE:
            do {
                initialSize = table->keys - table->isolated;
                result = cuddSifting(table,lower,upper);
                if (initialSize <= table->keys - table->isolated)
                    break;
#ifdef DD_STATS
                else
                    (void) fprintf(table->out,"\n");
#endif
            } while (result != 0);
            break;
        case CUDD_REORDER_SYMM_SIFT:
            result = cuddSymmSifting(table,lower,upper);
            break;
        case CUDD_REORDER_SYMM_SIFT_CONV:
            result = cuddSymmSiftingConv(table,lower,upper);
            break;
        case CUDD_REORDER_GROUP_SIFT:
            if (table->groupcheck == CUDD_NO_CHECK) {
                result = ddGroupSifting(table,lower,upper,ddNoCheck,
                                        DD_NORMAL_SIFT);
            } else if (table->groupcheck == CUDD_GROUP_CHECK5) {
                result = ddGroupSifting(table,lower,upper,ddExtSymmCheck,
                                        DD_NORMAL_SIFT);
            } else if (table->groupcheck == CUDD_GROUP_CHECK7) {
                result = ddGroupSifting(table,lower,upper,ddExtSymmCheck,
                                        DD_NORMAL_SIFT);
            } else {
                (void) fprintf(table->err,
                               "Unknown group ckecking method\n");
                result = 0;
            }
            break;
        case CUDD_REORDER_GROUP_SIFT_CONV:
            do {
                initialSize = table->keys - table->isolated;
                if (table->groupcheck == CUDD_NO_CHECK) {
                    result = ddGroupSifting(table,lower,upper,ddNoCheck,
                                            DD_NORMAL_SIFT);
                } else if (table->groupcheck == CUDD_GROUP_CHECK5) {
                    result = ddGroupSifting(table,lower,upper,ddExtSymmCheck,
                                            DD_NORMAL_SIFT);
                } else if (table->groupcheck == CUDD_GROUP_CHECK7) {
                    result = ddGroupSifting(table,lower,upper,ddExtSymmCheck,
                                            DD_NORMAL_SIFT);
                } else {
                    (void) fprintf(table->err,
                                   "Unknown group ckecking method\n");
                    result = 0;
                }
#ifdef DD_STATS
                (void) fprintf(table->out,"\n");
#endif
                result = cuddWindowReorder(table,lower,upper,
                                           CUDD_REORDER_WINDOW4);
                if (initialSize <= table->keys - table->isolated)
                    break;
#ifdef DD_STATS
                else
                    (void) fprintf(table->out,"\n");
#endif
            } while (result != 0);
            break;
        case CUDD_REORDER_WINDOW2:
        case CUDD_REORDER_WINDOW3:
        case CUDD_REORDER_WINDOW4:
        case CUDD_REORDER_WINDOW2_CONV:
        case CUDD_REORDER_WINDOW3_CONV:
        case CUDD_REORDER_WINDOW4_CONV:
            result = cuddWindowReorder(table,lower,upper,method);
            break;
        case CUDD_REORDER_ANNEALING:
            result = cuddAnnealing(table,lower,upper);
            break;
        case CUDD_REORDER_GENETIC:
            result = cuddGa(table,lower,upper);
            break;
        case CUDD_REORDER_LINEAR:
            result = cuddLinearAndSifting(table,lower,upper);
            break;
        case CUDD_REORDER_LINEAR_CONVERGE:
            do {
                initialSize = table->keys - table->isolated;
                result = cuddLinearAndSifting(table,lower,upper);
                if (initialSize <= table->keys - table->isolated)
                    break;
#ifdef DD_STATS
                else
                    (void) fprintf(table->out,"\n");
#endif
            } while (result != 0);
            break;
        case CUDD_REORDER_EXACT:
            result = cuddExact(table,lower,upper);
            break;
        case CUDD_REORDER_LAZY_SIFT:
            result = ddGroupSifting(table,lower,upper,ddVarGroupCheck,
                                    DD_LAZY_SIFT);
            break;
        default:
            return(0);
        }
    }

    /* Create a single group for all the variables that were sifted,
    ** so that they will be treated as a single block by successive
    ** invocations of ddGroupSifting.
    */
    ddMergeGroups(table,treenode,lower,upper);

#ifdef DD_DEBUG
    if (pr > 0) (void) fprintf(table->out,"ddReorderChildren:");
#endif

    return(result);

}